

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O0

void __thiscall proto3_arena_unittest::NestedTestAllTypes::Clear(NestedTestAllTypes *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_70;
  Voidify local_5a;
  byte local_59;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  NestedTestAllTypes *pNStack_18;
  uint32_t cached_has_bits;
  NestedTestAllTypes *this_local;
  
  this_local = (NestedTestAllTypes *)&this->field_0;
  local_1c = 0;
  pNStack_18 = this;
  google::protobuf::RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes>::Clear
            (&(this->field_0)._impl_.repeated_child_);
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 7) != 0) {
    if ((local_1c & 1) != 0) {
      local_31 = 0;
      if ((this->field_0)._impl_.child_ == (NestedTestAllTypes *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x128f,"_impl_.child_ != nullptr");
        local_31 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
      }
      if ((local_31 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      Clear((this->field_0)._impl_.child_);
    }
    if ((local_1c & 2) != 0) {
      local_59 = 0;
      if ((this->field_0)._impl_.payload_ == (TestAllTypes *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x1293,"_impl_.payload_ != nullptr");
        local_59 = 1;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar2);
      }
      if ((local_59 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_58);
      }
      proto3_arena_unittest::TestAllTypes::Clear((this->field_0)._impl_.payload_);
    }
    if ((local_1c & 4) != 0) {
      if ((this->field_0)._impl_.lazy_payload_ == (TestAllTypes *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_proto3_arena.pb.cc"
                   ,0x1297,"_impl_.lazy_payload_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_5a,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_70);
      }
      proto3_arena_unittest::TestAllTypes::Clear((this->field_0)._impl_.lazy_payload_);
    }
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void NestedTestAllTypes::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_arena_unittest.NestedTestAllTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_child_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.child_ != nullptr);
      _impl_.child_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.payload_ != nullptr);
      _impl_.payload_->Clear();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.lazy_payload_ != nullptr);
      _impl_.lazy_payload_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}